

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32 drwav__seek_from_start(drwav_seek_proc onSeek,drwav_uint64 offset,void *pUserData)

{
  int iVar1;
  undefined8 in_RDX;
  ulong in_RSI;
  code *in_RDI;
  ulong local_18;
  drwav_bool32 local_4;
  
  if (in_RSI < 0x80000000) {
    local_4 = (*in_RDI)(in_RDX,in_RSI & 0xffffffff,0);
  }
  else {
    iVar1 = (*in_RDI)(in_RDX,0x7fffffff,0);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      for (local_18 = in_RSI - 0x7fffffff; 0x7fffffff < local_18; local_18 = local_18 - 0x7fffffff)
      {
        iVar1 = (*in_RDI)(in_RDX,0x7fffffff,1);
        if (iVar1 == 0) {
          return 0;
        }
      }
      local_4 = (*in_RDI)(in_RDX,local_18 & 0xffffffff,1);
    }
  }
  return local_4;
}

Assistant:

static drwav_bool32 drwav__seek_from_start(drwav_seek_proc onSeek, drwav_uint64 offset, void* pUserData)
{
    if (offset <= 0x7FFFFFFF) {
        return onSeek(pUserData, (int)offset, drwav_seek_origin_start);
    }

    // Larger than 32-bit seek.
    if (!onSeek(pUserData, 0x7FFFFFFF, drwav_seek_origin_start)) {
        return DRWAV_FALSE;
    }
    offset -= 0x7FFFFFFF;

    for (;;) {
        if (offset <= 0x7FFFFFFF) {
            return onSeek(pUserData, (int)offset, drwav_seek_origin_current);
        }

        if (!onSeek(pUserData, 0x7FFFFFFF, drwav_seek_origin_current)) {
            return DRWAV_FALSE;
        }
        offset -= 0x7FFFFFFF;
    }

    // Should never get here.
    //return DRWAV_TRUE;
}